

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_vm.c
# Opt level: O1

_Bool gravity_vm_set(gravity_vm *vm,char *key,gravity_value_t value)

{
  gravity_class_t *pgVar1;
  int iVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_class_t *pgVar4;
  bool bVar5;
  
  aVar3 = value.field_1;
  pgVar4 = value.isa;
  if (key == (char *)0x0) {
    return false;
  }
  iVar2 = strcmp(key,"gcEnabled");
  if ((iVar2 == 0) && (gravity_class_bool == pgVar4)) {
    if ((gravity_float_t)aVar3.n == 0.0) {
      iVar2 = vm->gcenabled + -1;
    }
    else {
      iVar2 = vm->gcenabled + 1;
    }
    vm->gcenabled = iVar2;
  }
  else {
    iVar2 = strcmp(key,"gcMinThreshold");
    pgVar1 = gravity_class_int;
    if (gravity_class_int == pgVar4 && iVar2 == 0) {
      vm->gcminthreshold = (gravity_int_t)aVar3;
    }
    else {
      bVar5 = gravity_class_int == pgVar4;
      iVar2 = strcmp(key,"gcThreshold");
      if (iVar2 == 0 && bVar5) {
        vm->gcthreshold = (gravity_int_t)aVar3;
      }
      else {
        iVar2 = strcmp(key,"gcRatio");
        if ((iVar2 == 0) && (gravity_class_float == pgVar4)) {
          vm->gcratio = (gravity_float_t)aVar3;
        }
        else {
          iVar2 = strcmp(key,"maxCCalls");
          if (iVar2 == 0 && pgVar1 == pgVar4) {
            vm->maxccalls = value.field_1._0_4_;
          }
          else {
            iVar2 = strcmp(key,"maxBlock");
            if (iVar2 == 0 && pgVar1 == pgVar4) {
              vm->maxmemblock = aVar3.n & 0xffffffff;
            }
            else {
              iVar2 = strcmp(key,"maxRecursionDepth");
              if (iVar2 != 0 || pgVar1 != pgVar4) {
                return false;
              }
              vm->maxrecursion = aVar3.n & 0xffffffff;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool gravity_vm_set (gravity_vm *vm, const char *key, gravity_value_t value) {
    if (key) {
        if ((strcmp(key, GRAVITY_VM_GCENABLED) == 0) && VALUE_ISA_BOOL(value)) {VALUE_AS_BOOL(value) ? ++vm->gcenabled : --vm->gcenabled ; return true;}
        if ((strcmp(key, GRAVITY_VM_GCMINTHRESHOLD) == 0) && VALUE_ISA_INT(value)) {vm->gcminthreshold = VALUE_AS_INT(value); return true;}
        if ((strcmp(key, GRAVITY_VM_GCTHRESHOLD) == 0) && VALUE_ISA_INT(value)) {vm->gcthreshold = VALUE_AS_INT(value); return true;}
        if ((strcmp(key, GRAVITY_VM_GCRATIO) == 0) && VALUE_ISA_FLOAT(value)) {vm->gcratio = VALUE_AS_FLOAT(value); return true;}
        if ((strcmp(key, GRAVITY_VM_MAXCALLS) == 0) && VALUE_ISA_INT(value)) {vm->maxccalls = (uint32_t)VALUE_AS_INT(value); return true;}
        if ((strcmp(key, GRAVITY_VM_MAXBLOCK) == 0) && VALUE_ISA_INT(value)) {vm->maxmemblock = (uint32_t)VALUE_AS_INT(value); return true;}
        if ((strcmp(key, GRAVITY_VM_MAXRECURSION) == 0) && VALUE_ISA_INT(value)) {vm->maxrecursion = (uint32_t)VALUE_AS_INT(value); return true;}
    }
    return false;
}